

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

lua_Number lua_tonumberx(lua_State *L,int idx,int *pisnum)

{
  int iVar1;
  TValue *obj;
  lua_Number n;
  GCObject *local_10;
  
  local_10 = (GCObject *)0x0;
  obj = index2value(L,idx);
  if (obj->tt_ == '\x13') {
    local_10 = (obj->value_).gc;
    iVar1 = 1;
  }
  else {
    iVar1 = luaV_tonumber_(obj,(lua_Number *)&local_10);
  }
  if (pisnum != (int *)0x0) {
    *pisnum = iVar1;
  }
  return (lua_Number)local_10;
}

Assistant:

LUA_API lua_Number lua_tonumberx (lua_State *L, int idx, int *pisnum) {
  lua_Number n = 0;
  const TValue *o = index2value(L, idx);
  int isnum = tonumber(o, &n);
  if (pisnum)
    *pisnum = isnum;
  return n;
}